

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputIterator.hpp
# Opt level: O0

KeyValue<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_> * __thiscall
supermap::io::
InputIterator<supermap::KeyValue<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_>,_unsigned_long,_3UL,_void>
::next(InputIterator<supermap::KeyValue<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_>,_unsigned_long,_3UL,_void>
       *this)

{
  pointer pIVar1;
  long in_RSI;
  KeyValue<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_> *in_RDI;
  istream *in_stack_ffffffffffffffd8;
  
  *(long *)(in_RSI + 8) = *(long *)(in_RSI + 8) + 1;
  pIVar1 = std::
           unique_ptr<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>::
           operator->((unique_ptr<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>
                       *)0x12b711);
  (*(code *)**(undefined8 **)pIVar1)();
  deserialize<supermap::KeyValue<supermap::Key<1ul>,supermap::MaybeRemovedValue<supermap::ByteArray<1ul>>>,void>
            (in_stack_ffffffffffffffd8);
  return in_RDI;
}

Assistant:

T next() {
        ++index_;
        return deserialize<T>(input_->get());
    }